

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O2

void __thiscall generator_fsm_Test::TestBody(generator_fsm_Test *this)

{
  Generator *this_00;
  Port *pPVar1;
  Port *this_01;
  FSM *this_02;
  Const *pCVar2;
  Expr *pEVar3;
  Generator *top;
  enable_shared_from_this<kratos::Var> *__r;
  undefined1 local_1c8 [8];
  Context c;
  shared_ptr<kratos::Var> expr1;
  shared_ptr<kratos::Var> expr2;
  shared_ptr<kratos::FSMState> blue;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [8];
  shared_ptr<kratos::FSMState> red;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_src;
  
  kratos::Context::Context((Context *)local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"mod"
             ,(allocator<char> *)local_68);
  this_00 = kratos::Context::generator
                      ((Context *)local_1c8,
                       (string *)
                       &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"out"
             ,(allocator<char> *)local_68);
  pPVar1 = kratos::Generator::port
                     (this_00,Out,
                      (string *)
                      &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,2);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"in",
             (allocator<char> *)local_68);
  this_01 = kratos::Generator::port
                      (this_00,In,
                       (string *)
                       &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,2);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"clk"
             ,(allocator<char> *)local_68);
  kratos::Generator::port
            (this_00,In,
             (string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,1,1,
             Clock,false);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"rst"
             ,(allocator<char> *)local_68);
  kratos::Generator::port
            (this_00,In,
             (string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,1,1,
             AsyncReset,false);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Color",(allocator<char> *)local_68);
  this_02 = kratos::Generator::fsm
                      (this_00,(string *)
                               &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  __r = &(pPVar1->super_Var).super_enable_shared_from_this<kratos::Var>;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  kratos::FSM::output(this_02,(shared_ptr<kratos::Var> *)
                              &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,"Red"
             ,(allocator<char> *)
              &expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::FSM::add_state((FSM *)local_68,&this_02->fsm_name_);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Blue",(allocator<char> *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::FSM::add_state
            ((FSM *)&expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &this_02->fsm_name_);
  std::__cxx11::string::~string
            ((string *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pCVar2 = kratos::Const::constant(0,2,false);
  pEVar3 = kratos::Var::eq(&this_01->super_Var,&pCVar2->super_Var);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &c.tracked_generators_._M_h._M_single_bucket,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pEVar3->super_Var).super_enable_shared_from_this<kratos::Var>);
  kratos::FSMState::next
            ((FSMState *)local_68,(shared_ptr<kratos::FSMState> *)local_68,
             (shared_ptr<kratos::Var> *)&c.tracked_generators_._M_h._M_single_bucket);
  pCVar2 = kratos::Const::constant(1,2,false);
  pEVar3 = kratos::Var::eq(&this_01->super_Var,&pCVar2->super_Var);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &expr1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pEVar3->super_Var).super_enable_shared_from_this<kratos::Var>);
  kratos::FSMState::next
            ((FSMState *)local_68,
             (shared_ptr<kratos::FSMState> *)
             &expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<kratos::Var> *)
             &expr1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::FSMState::next
            ((FSMState *)
             expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::FSMState> *)local_68,
             (shared_ptr<kratos::Var> *)
             &expr1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  pCVar2 = kratos::Const::constant(2,2,false);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pCVar2->super_Var).super_enable_shared_from_this<kratos::Var>);
  kratos::FSMState::output
            ((FSMState *)local_68,
             (shared_ptr<kratos::Var> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<kratos::Var> *)
             &blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  pCVar2 = kratos::Const::constant(1,2,false);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pCVar2->super_Var).super_enable_shared_from_this<kratos::Var>);
  kratos::FSMState::output
            ((FSMState *)
             expr2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Var> *)
             &red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<kratos::Var> *)
             &blue.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mod_src);
  kratos::FSM::set_start_state(this_02,(shared_ptr<kratos::FSMState> *)local_68);
  kratos::realize_fsm(this_00);
  kratos::fix_assignment_type(this_00);
  kratos::verify_generator_connectivity(this_00);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (kratos *)this_00,top);
  kratos::is_valid_verilog
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&red.super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&red);
  kratos::Context::~Context((Context *)local_1c8);
  return;
}

Assistant:

TEST(generator, fsm) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &out_ = mod.port(PortDirection::Out, "out", 2);
    auto &in_ = mod.port(PortDirection::In, "in", 2);
    mod.port(PortDirection::In, "clk", 1, 1, PortType::Clock, false);
    mod.port(PortDirection::In, "rst", 1, 1, PortType::AsyncReset, false);

    auto &fsm = mod.fsm("Color");
    fsm.output(out_.shared_from_this());

    auto red = fsm.add_state("Red");
    auto blue = fsm.add_state("Blue");
    auto expr1 = in_.eq(constant(0, 2)).shared_from_this();
    red->next(red, expr1);
    auto expr2 = in_.eq(constant(1, 2)).shared_from_this();
    red->next(blue, expr2);
    blue->next(red, expr2);

    red->output(out_.shared_from_this(), constant(2, 2).shared_from_this());
    blue->output(out_.shared_from_this(), constant(1, 2).shared_from_this());
    fsm.set_start_state(red);

    realize_fsm(&mod);
    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    auto mod_src = generate_verilog(&mod);
    is_valid_verilog(mod_src);
}